

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

bool Js::VarIs<Js::ScriptFunction,Js::DynamicObject>(DynamicObject *obj)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptFunction *this;
  
  bVar1 = VarIsImpl<Js::JavascriptFunction>(&obj->super_RecyclableObject);
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(&obj->super_RecyclableObject);
    BVar2 = JavascriptFunction::IsScriptFunction(this);
    bVar1 = BVar2 != 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }